

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

void container_free(container_t *c,uint8_t type)

{
  undefined7 in_register_00000031;
  
  (*(code *)(&DAT_001263b8 +
            *(int *)(&DAT_001263b8 + (ulong)((int)CONCAT71(in_register_00000031,type) - 1) * 4)))();
  return;
}

Assistant:

void container_free(container_t *c, uint8_t type) {
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_free(CAST_bitset(c));
            break;
        case ARRAY_CONTAINER_TYPE:
            array_container_free(CAST_array(c));
            break;
        case RUN_CONTAINER_TYPE:
            run_container_free(CAST_run(c));
            break;
        case SHARED_CONTAINER_TYPE:
            shared_container_free(CAST_shared(c));
            break;
        default:
            assert(false);
            roaring_unreachable;
    }
}